

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeSplitLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  int iVar1;
  ShapeConstraint *pSVar2;
  int iVar3;
  string *psVar4;
  SplitLayerParams *this_00;
  uint64 uVar5;
  mapped_type *pmVar6;
  ShapeRange *pSVar7;
  ShapeRange local_78;
  mapped_type *local_58;
  ShapeConstraint *outputShape;
  mapped_type *local_30;
  ShapeConstraint *outputShape_1;
  int i;
  int nout;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  inputShape = (ShapeConstraint *)specLayer;
  specLayer_local = (NeuralNetworkLayer *)this;
  psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  _i = std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
       ::operator[](&this->blobShapes,psVar4);
  this_00 = Specification::NeuralNetworkLayer::split((NeuralNetworkLayer *)inputShape);
  uVar5 = Specification::SplitLayerParams::noutputs(this_00);
  outputShape_1._4_4_ = (int)uVar5;
  outputShape_1._0_4_ = 0;
  while( true ) {
    iVar1 = (int)outputShape_1;
    iVar3 = Specification::NeuralNetworkLayer::output_size((NeuralNetworkLayer *)inputShape);
    if (iVar3 <= iVar1) break;
    psVar4 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                       ((NeuralNetworkLayer *)inputShape,(int)outputShape_1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](&this->blobShapes,psVar4);
    local_30 = pmVar6;
    psVar4 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                       ((NeuralNetworkLayer *)inputShape,(int)outputShape_1);
    ShapeConstraint::setName(pmVar6,psVar4);
    pmVar6 = local_30;
    pSVar7 = ShapeConstraint::sequenceRange(_i);
    ShapeConstraint::updateSequenceRange(pmVar6,pSVar7);
    pmVar6 = local_30;
    pSVar7 = ShapeConstraint::batchRange(_i);
    ShapeConstraint::updateBatchRange(pmVar6,pSVar7);
    pmVar6 = local_30;
    pSVar7 = ShapeConstraint::channelRange(_i);
    ShapeRange::operator/((ShapeRange *)&outputShape,pSVar7,outputShape_1._4_4_);
    ShapeConstraint::updateChannelRange(pmVar6,(ShapeRange *)&outputShape);
    pmVar6 = local_30;
    pSVar7 = ShapeConstraint::heightRange(_i);
    ShapeConstraint::updateHeightRange(pmVar6,pSVar7);
    pmVar6 = local_30;
    pSVar7 = ShapeConstraint::widthRange(_i);
    ShapeConstraint::updateWidthRange(pmVar6,pSVar7);
    outputShape_1._0_4_ = (int)outputShape_1 + 1;
  }
  psVar4 = Specification::NeuralNetworkLayer::output_abi_cxx11_((NeuralNetworkLayer *)inputShape,0);
  local_58 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](&this->blobShapes,psVar4);
  pSVar2 = _i;
  pSVar7 = ShapeConstraint::sequenceRange(local_58);
  ShapeConstraint::updateSequenceRange(pSVar2,pSVar7);
  pSVar2 = _i;
  pSVar7 = ShapeConstraint::batchRange(local_58);
  ShapeConstraint::updateBatchRange(pSVar2,pSVar7);
  pSVar2 = _i;
  pSVar7 = ShapeConstraint::channelRange(local_58);
  ShapeRange::operator*(&local_78,pSVar7,(long)outputShape_1._4_4_);
  ShapeConstraint::updateChannelRange(pSVar2,&local_78);
  pSVar2 = _i;
  pSVar7 = ShapeConstraint::heightRange(local_58);
  ShapeConstraint::updateHeightRange(pSVar2,pSVar7);
  pSVar2 = _i;
  pSVar7 = ShapeConstraint::widthRange(local_58);
  ShapeConstraint::updateWidthRange(pSVar2,pSVar7);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeSplitLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Split layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Split layer " << specLayer.name() << " output shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        ShapeConstraint& outputShape = blobShapes[specLayer.output(i)];
        outputShape.setName(specLayer.output(i));
        std::cout << outputShape;
    }
#endif

    int nout = static_cast<int>(specLayer.split().noutputs());

    for (int i = 0; i < specLayer.output_size(); i++) {

        ShapeConstraint& outputShape = blobShapes[specLayer.output(i)];
        outputShape.setName(specLayer.output(i));

        outputShape.updateSequenceRange(inputShape.sequenceRange());
        outputShape.updateBatchRange(inputShape.batchRange());
        outputShape.updateChannelRange(inputShape.channelRange() / nout);
        outputShape.updateHeightRange(inputShape.heightRange());
        outputShape.updateWidthRange(inputShape.widthRange());

    }
    
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange() * static_cast<size_t>(nout));
    inputShape.updateHeightRange(outputShape.heightRange());
    inputShape.updateWidthRange(outputShape.widthRange());

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Split layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Split layer " << specLayer.name() << " output shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        ShapeConstraint& outputShape = blobShapes[specLayer.output(i)];
        outputShape.setName(specLayer.output(i));
        std::cout << outputShape;
    }
#endif


}